

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
         *this)

{
  Particle<(pica::Dimension)3> particle;
  Particle<(pica::Dimension)3> particle_00;
  bool bVar1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i_1;
  int i;
  ParticleArray particlesAnotherCopy;
  ParticleArray particlesCopy;
  ParticleArray particles;
  undefined8 in_stack_fffffffffffffc08;
  undefined1 success;
  String *in_stack_fffffffffffffc10;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffc18;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  int line;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Type type;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffc40;
  Message *in_stack_fffffffffffffc68;
  AssertHelper *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  uint uVar2;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffca0;
  ParticleArray *in_stack_fffffffffffffca8;
  ParticleArray *in_stack_fffffffffffffcb0;
  ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
  *in_stack_fffffffffffffcb8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  String *in_stack_fffffffffffffcd0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffcd8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffcf0;
  undefined8 local_308;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *pPStack_300;
  int local_2f0;
  undefined8 local_2e0;
  String *pSStack_2d8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *local_2d0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *pPStack_2c8;
  undefined8 local_2c0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *pPStack_2b8;
  undefined8 local_2b0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *pPStack_2a8;
  int local_294;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ParticleArraySoA
            (in_stack_fffffffffffffc40);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ParticleArraySoA
            (in_stack_fffffffffffffc40);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ParticleArraySoA
            (in_stack_fffffffffffffc40);
  for (local_294 = 0; local_294 < 9; local_294 = local_294 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              ((BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    particle.position.y = (double)in_stack_fffffffffffffcb8;
    particle.position.x = (double)in_stack_fffffffffffffcb0;
    particle.position.z = (double)in_stack_fffffffffffffcc0.ptr_;
    particle.p.x = (double)in_stack_fffffffffffffcc8;
    particle.p.y = (double)in_stack_fffffffffffffcd0;
    particle.p.z = (double)in_stack_fffffffffffffcd8;
    particle.factor = (FactorType)in_stack_fffffffffffffce0;
    particle.invGamma = (GammaType)in_stack_fffffffffffffce8;
    particle._64_8_ = in_stack_fffffffffffffcf0;
    in_stack_fffffffffffffc08 = local_2e0;
    in_stack_fffffffffffffc10 = pSStack_2d8;
    in_stack_fffffffffffffc18 = local_2d0;
    in_stack_fffffffffffffc20 = pPStack_2c8;
    in_stack_fffffffffffffc28 = local_2c0;
    in_stack_fffffffffffffc30 = pPStack_2b8;
    in_stack_fffffffffffffc38 = local_2b0;
    in_stack_fffffffffffffc40 = pPStack_2a8;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>(in_stack_fffffffffffffca0,particle);
  }
  local_2f0 = 0;
  while( true ) {
    type = (Type)((ulong)in_stack_fffffffffffffc38 >> 0x20);
    line = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    success = (undefined1)((ulong)in_stack_fffffffffffffc08 >> 0x38);
    if (10 < local_2f0) break;
    in_stack_fffffffffffffc08 = in_stack_fffffffffffffcc8;
    in_stack_fffffffffffffc10 = in_stack_fffffffffffffcd0;
    in_stack_fffffffffffffc18 = in_stack_fffffffffffffcd8;
    in_stack_fffffffffffffc20 = in_stack_fffffffffffffce0;
    in_stack_fffffffffffffc28 = in_stack_fffffffffffffce8;
    in_stack_fffffffffffffc30 = in_stack_fffffffffffffcf0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              ((BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    particle_00.position.y = (double)in_stack_fffffffffffffcb8;
    particle_00.position.x = (double)in_stack_fffffffffffffcb0;
    particle_00.position.z = (double)in_stack_fffffffffffffcc0.ptr_;
    particle_00.p.x = (double)in_stack_fffffffffffffc08;
    particle_00.p.y = (double)in_stack_fffffffffffffc10;
    particle_00.p.z = (double)in_stack_fffffffffffffc18;
    particle_00.factor = (FactorType)in_stack_fffffffffffffc20;
    particle_00.invGamma = (GammaType)in_stack_fffffffffffffc28;
    particle_00._64_8_ = in_stack_fffffffffffffc30;
    in_stack_fffffffffffffc38 = local_308;
    in_stack_fffffffffffffc40 = pPStack_300;
    in_stack_fffffffffffffcc8 = in_stack_fffffffffffffc08;
    in_stack_fffffffffffffcd0 = in_stack_fffffffffffffc10;
    in_stack_fffffffffffffcd8 = in_stack_fffffffffffffc18;
    in_stack_fffffffffffffce0 = in_stack_fffffffffffffc20;
    in_stack_fffffffffffffce8 = in_stack_fffffffffffffc28;
    in_stack_fffffffffffffcf0 = in_stack_fffffffffffffc30;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>(in_stack_fffffffffffffca0,particle_00);
    local_2f0 = local_2f0 + 1;
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::operator=
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::operator=
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::eqParticleArrays
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffc10,(bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffcb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc40);
    testing::internal::GetBoolAssertionFailureMessage
              ((AssertionResult *)in_stack_fffffffffffffc88.ptr_,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
    testing::internal::String::c_str((String *)&stack0xfffffffffffffc98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc40,type,(char *)in_stack_fffffffffffffc30,line
               ,(char *)in_stack_fffffffffffffc20);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc10);
    testing::internal::String::~String(in_stack_fffffffffffffc10);
    testing::Message::~Message((Message *)0x214771);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21481b);
  if (uVar2 == 0) {
    ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
    eqParticleArrays(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffc10,(bool)success);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc80);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)in_stack_fffffffffffffc88.ptr_,in_stack_fffffffffffffc80,
                 in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
      testing::internal::String::c_str((String *)&stack0xfffffffffffffc60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc40,type,(char *)in_stack_fffffffffffffc30,
                 line,(char *)in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc10);
      testing::internal::String::~String(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x214914);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2149b2);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc30);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc30);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc30);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}